

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * get_GLSL_uniform_array_varname(Context *ctx,RegisterType regtype,char *buf,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = ctx->shader_type_str;
  if (regtype == REG_TYPE_CONST) {
    pcVar2 = "vec4";
  }
  else if (regtype == REG_TYPE_CONSTBOOL) {
    pcVar2 = "bool";
  }
  else if (regtype == REG_TYPE_CONSTINT) {
    pcVar2 = "ivec4";
  }
  else {
    pcVar2 = (char *)0x0;
    failf(ctx,"%s","BUG: used a uniform we don\'t know how to define.");
  }
  snprintf(buf,0x40,"%s_uniforms_%s",pcVar1,pcVar2);
  return buf;
}

Assistant:

static const char *get_GLSL_uniform_array_varname(Context *ctx,
                                                  const RegisterType regtype,
                                                  char *buf, const size_t len)
{
    const char *shadertype = ctx->shader_type_str;
    const char *type = get_GLSL_uniform_type(ctx, regtype);
    snprintf(buf, len, "%s_uniforms_%s", shadertype, type);
    return buf;
}